

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.cpp
# Opt level: O2

void __thiscall rlottie::internal::renderer::SolidLayer::updateContent(SolidLayer *this)

{
  VPath *this_00;
  DirtyFlag *pDVar1;
  float fVar2;
  float fVar3;
  VSize VVar4;
  Extra *pEVar5;
  uint uVar6;
  VColor local_5c;
  Color local_58;
  VBrush brush;
  
  uVar6 = (this->super_Layer).mDirtyFlag.i;
  if ((uVar6 & 1) != 0) {
    this_00 = &this->mPath;
    VPath::reset(this_00);
    VVar4 = ((this->super_Layer).mLayerData)->mLayerSize;
    brush.mType = NoBrush;
    brush._4_4_ = 0;
    brush.field_1._4_4_ = (float)VVar4.mh;
    brush.field_1.mColor = (VColor)(float)VVar4.mw;
    VPath::addRect(this_00,(VRectF *)&brush,CW);
    brush.mType = (Type)(this->super_Layer).mCombinedMatrix.m11;
    brush._4_4_ = (this->super_Layer).mCombinedMatrix.m12;
    brush.field_1 =
         *(anon_union_8_3_adf75f03_for_VBrush_2 *)&(this->super_Layer).mCombinedMatrix.m13;
    VPath::transform(this_00,(VMatrix *)&brush);
    pDVar1 = &(this->mRenderNode).super_VDrawable.mFlag;
    *(byte *)&pDVar1->i = (byte)pDVar1->i | 2;
    vcow_ptr<VPath::VPathData>::operator=
              ((vcow_ptr<VPath::VPathData> *)&this->mRenderNode,&this_00->d);
    uVar6 = (this->super_Layer).mDirtyFlag.i;
  }
  if ((uVar6 & 2) != 0) {
    pEVar5 = (((this->super_Layer).mLayerData)->mExtra)._M_t.
             super___uniq_ptr_impl<rlottie::internal::model::Layer::Extra,_std::default_delete<rlottie::internal::model::Layer::Extra>_>
             ._M_t.
             super__Tuple_impl<0UL,_rlottie::internal::model::Layer::Extra_*,_std::default_delete<rlottie::internal::model::Layer::Extra>_>
             .super__Head_base<0UL,_rlottie::internal::model::Layer::Extra_*,_false>._M_head_impl;
    if (pEVar5 == (Extra *)0x0) {
      fVar2 = 1.0;
      fVar3 = 1.0;
      local_58.b = 1.0;
    }
    else {
      fVar2 = (pEVar5->mSolidColor).r;
      fVar3 = (pEVar5->mSolidColor).g;
      local_58.b = (pEVar5->mSolidColor).b;
    }
    local_58.g = fVar3;
    local_58.r = fVar2;
    local_5c = model::Color::toColor(&local_58,(this->super_Layer).mCombinedAlpha);
    VBrush::VBrush(&brush,&local_5c);
    (this->mRenderNode).super_VDrawable.mBrush.mType = brush.mType;
    *(undefined4 *)&(this->mRenderNode).super_VDrawable.mBrush.field_0x4 = brush._4_4_;
    (this->mRenderNode).super_VDrawable.mBrush.field_1 = brush.field_1;
    pDVar1 = &(this->mRenderNode).super_VDrawable.mFlag;
    *(byte *)&pDVar1->i = (byte)pDVar1->i | 8;
  }
  return;
}

Assistant:

void renderer::SolidLayer::updateContent()
{
    if (flag() & DirtyFlagBit::Matrix) {
        mPath.reset();
        mPath.addRect(VRectF(0, 0, mLayerData->layerSize().width(),
                            mLayerData->layerSize().height()));
        mPath.transform(combinedMatrix());
        mRenderNode.mFlag |= VDrawable::DirtyState::Path;
        mRenderNode.mPath = mPath;
    }
    if (flag() & DirtyFlagBit::Alpha) {
        model::Color color = mLayerData->solidColor();
        VBrush       brush(color.toColor(combinedAlpha()));
        mRenderNode.setBrush(brush);
        mRenderNode.mFlag |= VDrawable::DirtyState::Brush;
    }
}